

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

bool __thiscall
despot::Parser::IsSelfLoopingWithoutReward(Parser *this,vector<int,_std::allocator<int>_> *state)

{
  set<std::vector<int,_std::allocator<int>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *this_00;
  pointer piVar1;
  pointer piVar2;
  pointer pSVar3;
  pointer pSVar4;
  pointer pNVar5;
  CPT *pCVar6;
  pointer pFVar7;
  iterator iVar8;
  long lVar9;
  int s;
  long lVar10;
  int s_1;
  ulong uVar11;
  int a;
  int iVar12;
  double extraout_XMM0_Qa;
  double dVar13;
  
  this_00 = &this->selfloop_state_set_;
  iVar8 = std::
          _Rb_tree<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_std::_Identity<std::vector<int,_std::allocator<int>_>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::find(&this_00->_M_t,state);
  if ((_Rb_tree_header *)iVar8._M_node ==
      &(this->selfloop_state_set_)._M_t._M_impl.super__Rb_tree_header) {
    piVar1 = (state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    piVar2 = (state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    pSVar3 = (this->prev_state_vars_).
             super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar4 = (this->curr_state_vars_).
             super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = 0x14;
    for (lVar10 = 0; (long)piVar2 - (long)piVar1 >> 2 != lVar10; lVar10 = lVar10 + 1) {
      iVar12 = piVar1[lVar10];
      *(int *)((long)&(pSVar3->super_NamedVar).super_Variable._vptr_Variable + lVar9 * 4) = iVar12;
      *(int *)((long)&(pSVar4->super_NamedVar).super_Variable._vptr_Variable + lVar9 * 4) = iVar12;
      lVar9 = lVar9 + 0x30;
    }
    for (iVar12 = 0;
        pNVar5 = (this->action_vars_).
                 super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl.
                 super__Vector_impl_data._M_start,
        iVar12 < (int)((ulong)((long)(pNVar5->super_Variable).values_.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              *(long *)&(pNVar5->super_Variable).values_.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data) >> 5); iVar12 = iVar12 + 1
        ) {
      (pNVar5->super_Variable).curr_value = iVar12;
      uVar11 = 0;
      while (piVar1 = (state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start,
            uVar11 < (ulong)((long)(state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_finish - (long)piVar1 >> 2)) {
        pCVar6 = (this->transition_funcs_).
                 super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar11];
        (*(pCVar6->super_Function)._vptr_Function[5])(pCVar6,(ulong)(uint)piVar1[uVar11]);
        uVar11 = uVar11 + 1;
        if (extraout_XMM0_Qa != 1.0) {
          return false;
        }
        if (NAN(extraout_XMM0_Qa)) {
          return false;
        }
      }
      uVar11 = 0xffffffffffffffff;
      lVar9 = 0;
      while( true ) {
        pFVar7 = (this->reward_funcs_).
                 super__Vector_base<despot::Function,_std::allocator<despot::Function>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar10 = (long)(this->reward_funcs_).
                       super__Vector_base<despot::Function,_std::allocator<despot::Function>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pFVar7;
        uVar11 = uVar11 + 1;
        if ((ulong)(lVar10 / 0x58) <= uVar11) break;
        dVar13 = (double)(**(code **)(*(long *)((long)&pFVar7->_vptr_Function + lVar9) + 0x28))
                                   ((long)&pFVar7->_vptr_Function + lVar9,0,lVar10 % 0x58);
        if ((dVar13 != 0.0) || (lVar9 = lVar9 + 0x58, NAN(dVar13))) {
          return false;
        }
      }
    }
    if (this->enable_selfloop_cache_ == true) {
      if (10000 < (this->selfloop_state_set_)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
        std::
        _Rb_tree<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_std::_Identity<std::vector<int,_std::allocator<int>_>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::erase(&this_00->_M_t,
                (this->selfloop_state_queue_).c.
                super__Deque_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur);
        std::
        deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::pop_front(&(this->selfloop_state_queue_).c);
      }
      std::
      _Rb_tree<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,std::_Identity<std::vector<int,std::allocator<int>>>,std::less<std::vector<int,std::allocator<int>>>,std::allocator<std::vector<int,std::allocator<int>>>>
      ::_M_insert_unique<std::vector<int,std::allocator<int>>const&>
                ((_Rb_tree<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,std::_Identity<std::vector<int,std::allocator<int>>>,std::less<std::vector<int,std::allocator<int>>>,std::allocator<std::vector<int,std::allocator<int>>>>
                  *)this_00,state);
      std::
      deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::push_back(&(this->selfloop_state_queue_).c,state);
    }
  }
  return true;
}

Assistant:

bool Parser::IsSelfLoopingWithoutReward(const vector<int>& state) const {
	if (selfloop_state_set_.find(state) != selfloop_state_set_.end())
		return true;

	for (int s = 0; s < state.size(); s++) {
		prev_state_vars_[s].curr_value = state[s];
		curr_state_vars_[s].curr_value = state[s];
	}

	for (int a = 0; a < action_vars_[0].Size(); a++) {
		action_vars_[0].curr_value = a;

		for (int s = 0; s < state.size(); s++) {
			if (transition_funcs_[s]->GetValue(state[s]) != 1.0)
				return false;
		}

		for (int r = 0; r < reward_funcs_.size(); r++) {
			if (reward_funcs_[r].GetValue() != 0)
				return false;
		}
	}

	if (enable_selfloop_cache_) {
		if (selfloop_state_set_.size() > 10000) { // Replace the oldest state by the new one
			selfloop_state_set_.erase(selfloop_state_queue_.front());
			selfloop_state_queue_.pop();
		}

		selfloop_state_set_.insert(state);
		selfloop_state_queue_.push(state);
	}

	return true;
}